

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O0

bool __thiscall
SoftSynthMIDIDevice::ServiceStream(SoftSynthMIDIDevice *this,void *buff,int numbytes)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int next;
  int samplesleft;
  int tick_in;
  double ticky;
  bool res;
  bool prev_ended;
  void *pvStack_30;
  int numsamples;
  float *samples1;
  float *samples;
  int numbytes_local;
  void *buff_local;
  SoftSynthMIDIDevice *this_local;
  
  ticky._4_4_ = (uint)((ulong)(long)numbytes >> 3);
  ticky._2_1_ = true;
  memset(buff,0,(long)numbytes);
  FCriticalSection::Enter(&this->CritSec);
  pvStack_30 = buff;
  do {
    do {
      if (this->Events == (MIDIHDR *)0x0 || (int)ticky._4_4_ < 1) {
LAB_004204c4:
        if (this->Events == (MIDIHDR *)0x0) {
          ticky._2_1_ = false;
        }
        FCriticalSection::Leave(&this->CritSec);
        return ticky._2_1_;
      }
      dVar1 = this->NextTickIn;
      uVar2 = MIN<int>(ticky._4_4_,(int)this->NextTickIn);
      if (0 < (int)uVar2) {
        (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x1d])(this,pvStack_30,(ulong)uVar2);
        if ((this->NextTickIn != dVar1) || (NAN(this->NextTickIn) || NAN(dVar1))) {
          __assert_fail("NextTickIn == ticky",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                        ,0x198,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
        }
        this->NextTickIn = this->NextTickIn - (double)(int)uVar2;
        if (this->NextTickIn < 0.0) {
          __assert_fail("NextTickIn >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                        ,0x19a,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
        }
        ticky._4_4_ = ticky._4_4_ - uVar2;
        pvStack_30 = (void *)((long)pvStack_30 + (long)(int)(uVar2 << 1) * 4);
      }
    } while (1.0 < this->NextTickIn || this->NextTickIn == 1.0);
    iVar3 = PlayTick(this);
    if (iVar3 < 0) {
      __assert_fail("next >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                    ,0x1a2,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
    }
    if (iVar3 == 0) {
      if (0 < (int)ticky._4_4_) {
        (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x1d])(this,pvStack_30,(ulong)ticky._4_4_);
      }
      ticky._2_1_ = false;
      goto LAB_004204c4;
    }
    this->NextTickIn = this->SamplesPerTick * (double)iVar3 + this->NextTickIn;
    if (this->NextTickIn < 0.0) {
      __assert_fail("NextTickIn >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                    ,0x1af,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
    }
  } while( true );
}

Assistant:

bool SoftSynthMIDIDevice::ServiceStream (void *buff, int numbytes)
{
	float *samples = (float *)buff;
	float *samples1;
	int numsamples = numbytes / sizeof(float) / 2;
	bool prev_ended = false;
	bool res = true;

	samples1 = samples;
	memset(buff, 0, numbytes);

	CritSec.Enter();
	while (Events != NULL && numsamples > 0)
	{
		double ticky = NextTickIn;
		int tick_in = int(NextTickIn);
		int samplesleft = MIN(numsamples, tick_in);

		if (samplesleft > 0)
		{
			ComputeOutput(samples1, samplesleft);
			assert(NextTickIn == ticky);
			NextTickIn -= samplesleft;
			assert(NextTickIn >= 0);
			numsamples -= samplesleft;
			samples1 += samplesleft * 2;
		}
		
		if (NextTickIn < 1)
		{
			int next = PlayTick();
			assert(next >= 0);
			if (next == 0)
			{ // end of song
				if (numsamples > 0)
				{
					ComputeOutput(samples1, numsamples);
				}
				res = false;
				break;
			}
			else
			{
				NextTickIn += SamplesPerTick * next;
				assert(NextTickIn >= 0);
			}
		}
	}

	if (Events == NULL)
	{
		res = false;
	}
	CritSec.Leave();
	return res;
}